

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_gfx_unload_mesh(rf_mesh mesh)

{
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_buffers(mesh.triangle_count);
  rf_gfx_delete_vertex_arrays(mesh.vertices._4_4_);
  return;
}

Assistant:

RF_API void rf_gfx_unload_mesh(rf_mesh mesh)
{
    rf_gfx_delete_buffers(mesh.vbo_id[0]);   // vertex
    rf_gfx_delete_buffers(mesh.vbo_id[1]);   // texcoords
    rf_gfx_delete_buffers(mesh.vbo_id[2]);   // normals
    rf_gfx_delete_buffers(mesh.vbo_id[3]);   // colors
    rf_gfx_delete_buffers(mesh.vbo_id[4]);   // tangents
    rf_gfx_delete_buffers(mesh.vbo_id[5]);   // texcoords2
    rf_gfx_delete_buffers(mesh.vbo_id[6]);   // indices

    rf_gfx_delete_vertex_arrays(mesh.vao_id);
}